

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::AddVisibilityPresetFlags
          (cmLocalGenerator *this,string *flags,cmTarget *target,string *lang)

{
  pointer pcVar1;
  cmTarget *pcVar2;
  bool bVar3;
  PolicyStatus PVar4;
  int iVar5;
  long *plVar6;
  char *pcVar7;
  char *__s1;
  undefined8 *puVar8;
  ostream *poVar9;
  size_t sVar10;
  cmake *this_00;
  cmListFileBacktrace *bt;
  size_type *psVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  PolicyID id;
  _Alloc_hider _Var13;
  pair<std::_Rb_tree_iterator<const_cmTarget_*>,_bool> pVar14;
  string l;
  string flagDefine;
  string compileOption;
  string warnCMP0063;
  string option;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  cmTarget *local_240;
  char **local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  string local_1f0;
  string *local_1d0;
  char *local_1c8;
  long local_1c0;
  char local_1b8;
  undefined7 uStack_1b7;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  if (lang->_M_string_length == 0) {
    return;
  }
  local_1c8 = &local_1b8;
  local_1c0 = 0;
  local_1b8 = '\0';
  local_240 = target;
  local_1d0 = flags;
  if (((target->TargetTypeValue & ~STATIC_LIBRARY) == SHARED_LIBRARY) ||
     (bVar3 = cmTarget::IsExecutableWithExports(target), bVar3)) {
LAB_0031a5b4:
    local_238 = (char **)0x0;
  }
  else {
    PVar4 = cmPolicies::PolicyMap::Get(&local_240->PolicyMap,CMP0063);
    if (PVar4 == OLD) goto LAB_0031ad8a;
    if (PVar4 != WARN) goto LAB_0031a5b4;
    local_238 = &local_1c8;
  }
  pcVar2 = local_240;
  pcVar1 = (lang->_M_dataplus)._M_p;
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_260,pcVar1,pcVar1 + lang->_M_string_length);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 "CMAKE_",&local_260);
  plVar6 = (long *)std::__cxx11::string::append(local_1a8);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_1f0.field_2._M_allocated_capacity = *psVar11;
    local_1f0.field_2._8_8_ = plVar6[3];
  }
  else {
    local_1f0.field_2._M_allocated_capacity = *psVar11;
    local_1f0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_1f0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._M_allocated_capacity + 1));
  }
  pcVar7 = cmMakefile::GetDefinition(this->Makefile,&local_1f0);
  if (pcVar7 != (char *)0x0) {
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_210,local_260._M_dataplus._M_p,
               (char *)(local_260._M_string_length + (long)local_260._M_dataplus._M_p));
    std::__cxx11::string::append((char *)&local_210);
    __s1 = cmTarget::GetProperty(pcVar2,&local_210);
    if (__s1 != (char *)0x0) {
      if (local_238 == (char **)0x0) {
        iVar5 = strcmp(__s1,"hidden");
        if ((((iVar5 == 0) || (iVar5 = strcmp(__s1,"default"), iVar5 == 0)) ||
            (iVar5 = strcmp(__s1,"protected"), iVar5 == 0)) ||
           (iVar5 = strcmp(__s1,"internal"), iVar5 == 0)) {
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          sVar10 = strlen(pcVar7);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_230,pcVar7,pcVar7 + sVar10);
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_230);
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 == paVar12) {
            local_198[0]._0_8_ = paVar12->_M_allocated_capacity;
            local_198[0]._8_8_ = puVar8[3];
            local_1a8._0_8_ = local_198;
          }
          else {
            local_198[0]._0_8_ = paVar12->_M_allocated_capacity;
            local_1a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar8;
          }
          local_1a8._8_8_ = puVar8[1];
          *puVar8 = paVar12;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,
                            (ulong)(local_230.field_2._M_allocated_capacity + 1));
          }
          (*this->_vptr_cmLocalGenerator[5])(this,local_1d0,local_1a8);
          local_230.field_2._M_allocated_capacity = local_198[0]._M_allocated_capacity;
          _Var13._M_p = (pointer)local_1a8._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._0_8_ != local_198) goto LAB_0031a9d4;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target ",7);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(pcVar2->Name)._M_dataplus._M_p,
                              (pcVar2->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," uses unsupported value \"",0x19);
          sVar10 = strlen(__s1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,__s1,sVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" for ",6);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,local_210._M_dataplus._M_p,local_210._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,".",1);
          std::__cxx11::stringbuf::str();
          cmSystemTools::Error(local_230._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,
                            (ulong)(local_230.field_2._M_allocated_capacity + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
      }
      else {
        std::operator+(&local_230,"  ",&local_210);
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_230);
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 == paVar12) {
          local_198[0]._0_8_ = paVar12->_M_allocated_capacity;
          local_198[0]._8_8_ = puVar8[3];
          local_1a8._0_8_ = local_198;
        }
        else {
          local_198[0]._0_8_ = paVar12->_M_allocated_capacity;
          local_1a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar8;
        }
        local_1a8._8_8_ = puVar8[1];
        *puVar8 = paVar12;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_238,local_1a8._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._0_8_ != local_198) {
          operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._M_allocated_capacity + 1));
        }
        _Var13._M_p = local_230._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
LAB_0031a9d4:
          operator_delete(_Var13._M_p,(ulong)(local_230.field_2._M_allocated_capacity + 1));
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,(ulong)(local_260.field_2._M_allocated_capacity + 1))
    ;
  }
  iVar5 = std::__cxx11::string::compare((char *)lang);
  pcVar2 = local_240;
  if (iVar5 == 0) {
    local_260._M_dataplus._M_p = (pointer)0x33;
    local_1a8._0_8_ = local_198;
    local_1a8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1a8,(ulong)&local_260);
    local_198[0]._M_allocated_capacity = local_260._M_dataplus._M_p;
    *(char *)(local_1a8._0_8_ + 0x20) = 'L';
    *(char *)(local_1a8._0_8_ + 0x21) = 'I';
    *(char *)(local_1a8._0_8_ + 0x22) = 'T';
    *(char *)(local_1a8._0_8_ + 0x23) = 'Y';
    *(char *)(local_1a8._0_8_ + 0x24) = '_';
    *(char *)(local_1a8._0_8_ + 0x25) = 'I';
    *(char *)(local_1a8._0_8_ + 0x26) = 'N';
    *(char *)(local_1a8._0_8_ + 0x27) = 'L';
    *(char *)(local_1a8._0_8_ + 0x28) = 'I';
    *(char *)(local_1a8._0_8_ + 0x29) = 'N';
    *(char *)(local_1a8._0_8_ + 0x2a) = 'E';
    *(char *)(local_1a8._0_8_ + 0x2b) = 'S';
    *(char *)(local_1a8._0_8_ + 0x2c) = '_';
    *(char *)(local_1a8._0_8_ + 0x2d) = 'H';
    *(char *)(local_1a8._0_8_ + 0x2e) = 'I';
    *(char *)(local_1a8._0_8_ + 0x2f) = 'D';
    *(char *)(local_1a8._0_8_ + 0x10) = 'E';
    *(char *)(local_1a8._0_8_ + 0x11) = '_';
    *(char *)(local_1a8._0_8_ + 0x12) = 'O';
    *(char *)(local_1a8._0_8_ + 0x13) = 'P';
    *(char *)(local_1a8._0_8_ + 0x14) = 'T';
    *(char *)(local_1a8._0_8_ + 0x15) = 'I';
    *(char *)(local_1a8._0_8_ + 0x16) = 'O';
    *(char *)(local_1a8._0_8_ + 0x17) = 'N';
    *(char *)(local_1a8._0_8_ + 0x18) = 'S';
    *(char *)(local_1a8._0_8_ + 0x19) = '_';
    *(char *)(local_1a8._0_8_ + 0x1a) = 'V';
    *(char *)(local_1a8._0_8_ + 0x1b) = 'I';
    *(char *)(local_1a8._0_8_ + 0x1c) = 'S';
    *(char *)(local_1a8._0_8_ + 0x1d) = 'I';
    *(char *)(local_1a8._0_8_ + 0x1e) = 'B';
    *(char *)(local_1a8._0_8_ + 0x1f) = 'I';
    *(undefined8 *)local_1a8._0_8_ = 0x58435f454b414d43;
    *(char *)(local_1a8._0_8_ + 8) = 'X';
    *(char *)(local_1a8._0_8_ + 9) = '_';
    *(char *)(local_1a8._0_8_ + 10) = 'C';
    *(char *)(local_1a8._0_8_ + 0xb) = 'O';
    *(char *)(local_1a8._0_8_ + 0xc) = 'M';
    *(char *)(local_1a8._0_8_ + 0xd) = 'P';
    *(char *)(local_1a8._0_8_ + 0xe) = 'I';
    *(char *)(local_1a8._0_8_ + 0xf) = 'L';
    *(char *)(local_1a8._0_8_ + 0x2f) = 'D';
    *(char *)(local_1a8._0_8_ + 0x30) = 'D';
    *(char *)(local_1a8._0_8_ + 0x31) = 'E';
    *(char *)(local_1a8._0_8_ + 0x32) = 'N';
    local_1a8._8_8_ = local_260._M_dataplus._M_p;
    *(char *)(local_1a8._0_8_ + (long)local_260._M_dataplus._M_p) = '\0';
    pcVar7 = cmMakefile::GetDefinition(this->Makefile,(string *)local_1a8);
    if (pcVar7 != (char *)0x0) {
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      local_1f0._M_dataplus._M_p = (pointer)0x19;
      local_260._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_260,(ulong)&local_1f0);
      local_260.field_2._M_allocated_capacity = (size_type)local_1f0._M_dataplus._M_p;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p + 9) = 'Y';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p + 10) = '_';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p + 0xb) = 'I';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p + 0xc) = 'N';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p + 0xd) = 'L';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p + 0xe) = 'I';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p + 0xf) = 'N';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p + 0x10) = 'E';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p + 0x11) = 'S';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p + 0x12) = '_';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p + 0x13) = 'H';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p + 0x14) = 'I';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p + 0x15) = 'D';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p + 0x16) = 'D';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p + 0x17) = 'E';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p + 0x18) = 'N';
      *(undefined8 *)local_260._M_dataplus._M_p = 0x494c494249534956;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p + 8) = 'T';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p + 9) = 'Y';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p + 10) = '_';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p + 0xb) = 'I';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p + 0xc) = 'N';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p + 0xd) = 'L';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p + 0xe) = 'I';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p + 0xf) = 'N';
      local_260._M_string_length = (size_type)local_1f0._M_dataplus._M_p;
      local_260._M_dataplus._M_p[(long)local_1f0._M_dataplus._M_p] = '\0';
      bVar3 = cmTarget::GetPropertyAsBool(pcVar2,&local_260);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,
                        (ulong)(local_260.field_2._M_allocated_capacity + 1));
      }
      if (bVar3) {
        if (local_238 == (char **)0x0) {
          (*this->_vptr_cmLocalGenerator[6])(this,local_1d0,pcVar7);
        }
        else {
          std::__cxx11::string::append((char *)local_238);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._M_allocated_capacity + 1));
    }
  }
  if ((local_1c0 != 0) &&
     (pVar14 = std::
               _Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
               ::_M_insert_unique<cmTarget_const*const&>
                         ((_Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
                           *)&this->WarnCMP0063,&local_240),
     ((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_260,(cmPolicies *)0x3f,id);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_260._M_dataplus._M_p,local_260._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\nTarget \"",9);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(local_240->Name)._M_dataplus._M_p,(local_240->Name)._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" of type \"",0xb);
    pcVar7 = cmTarget::GetTargetTypeName(local_240->TargetTypeValue);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)poVar9->_vptr_basic_ostream[-3]);
    }
    else {
      sVar10 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar7,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\" has the following visibility properties set for ",0x32);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(lang->_M_dataplus)._M_p,lang->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,":\n",2);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_1c8,local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"For compatibility CMake is not honoring them for this target.",0x3d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,
                      (ulong)(local_260.field_2._M_allocated_capacity + 1));
    }
    this_00 = cmMakefile::GetCMakeInstance(local_240->Makefile);
    std::__cxx11::stringbuf::str();
    bt = cmTarget::GetBacktrace(local_240);
    cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_260,bt);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,
                      (ulong)(local_260.field_2._M_allocated_capacity + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
LAB_0031ad8a:
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator
::AddVisibilityPresetFlags(std::string &flags, cmTarget const* target,
                            const std::string& lang)
{
  if (lang.empty())
    {
    return;
    }

  std::string warnCMP0063;
  std::string *pWarnCMP0063 = 0;
  if (target->GetType() != cmTarget::SHARED_LIBRARY &&
      target->GetType() != cmTarget::MODULE_LIBRARY &&
      !target->IsExecutableWithExports())
    {
    switch (target->GetPolicyStatusCMP0063())
      {
      case cmPolicies::OLD:
        return;
      case cmPolicies::WARN:
        pWarnCMP0063 = &warnCMP0063;
        break;
      default:
        break;
      }
    }

  AddVisibilityCompileOption(flags, target, this, lang, pWarnCMP0063);

  if(lang == "CXX")
    {
    AddInlineVisibilityCompileOption(flags, target, this, pWarnCMP0063);
    }

  if (!warnCMP0063.empty() &&
      this->WarnCMP0063.insert(target).second)
    {
    std::ostringstream w;
    w <<
      cmPolicies::GetPolicyWarning(cmPolicies::CMP0063) << "\n"
      "Target \"" << target->GetName() << "\" of "
      "type \"" << cmTarget::GetTargetTypeName(target->GetType()) << "\" "
      "has the following visibility properties set for " << lang << ":\n" <<
      warnCMP0063 <<
      "For compatibility CMake is not honoring them for this target.";
    target->GetMakefile()->GetCMakeInstance()
      ->IssueMessage(cmake::AUTHOR_WARNING, w.str(), target->GetBacktrace());
    }
}